

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFPageObjectHelper::forEachImage
          (QPDFPageObjectHelper *this,bool recursive,
          function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action)

{
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  _Manager_type local_28;
  
  std::
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_38,action);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(QPDFObjectHandle),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:362:39)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(QPDFObjectHandle),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFPageObjectHelper.cc:362:39)>
             ::_M_manager;
  forEachXObject(this,recursive,
                 (function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_38,(function<bool_(QPDFObjectHandle)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::forEachImage(
    bool recursive,
    std::function<void(QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key)>
        action)
{
    forEachXObject(recursive, action, [](QPDFObjectHandle obj) { return obj.isImage(); });
}